

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

string * chaiscript::exception::eval_error::format
                   (string *__return_storage_ptr__,string *t_why,
                   vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                   *t_parameters,bool t_dot_notation,Dispatch_Engine *t_ss)

{
  ostream *poVar1;
  Dispatch_Engine *t_ss_00;
  stringstream ss;
  string sStack_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  t_ss_00 = t_ss;
  std::__cxx11::stringstream::stringstream(local_1b8);
  format_why(&sStack_1d8,t_why);
  std::operator<<(local_1a8,(string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::operator<<(local_1a8," ");
  poVar1 = std::operator<<(local_1a8,"With parameters: ");
  format_parameters_abi_cxx11_
            (&sStack_1d8,(eval_error *)t_parameters,
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             (ulong)t_dot_notation,SUB81(t_ss,0),t_ss_00);
  std::operator<<(poVar1,(string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::operator<<(local_1a8," ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

static std::string format(const std::string &t_why, 
          const std::vector<Boxed_Value> &t_parameters, 
          bool t_dot_notation,
          const chaiscript::detail::Dispatch_Engine &t_ss)
      {
        std::stringstream ss;

        ss << format_why(t_why);
        ss << " ";

        ss << "With parameters: " << format_parameters(t_parameters, t_dot_notation, t_ss);
        ss << " ";

        return ss.str();
      }